

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * ApprovalTests::TestName::checkParentDirectoriesForFile(string *file)

{
  bool bVar1;
  string *in_RDI;
  int i;
  string prefix;
  string backOne;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> newFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *candidateName;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string *this;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar3;
  uint in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar4;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [16];
  string *in_stack_ffffffffffffffb0;
  string local_30 [48];
  
  this = in_RDI;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bVar1 = FileUtils::fileExists(in_stack_ffffffffffffffb0);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff50);
  if (!bVar1) {
    SystemUtils::getDirectorySeparator_abi_cxx11_();
    ::std::operator+((char *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    ::std::__cxx11::string::~string(local_80);
    ::std::__cxx11::string::string(local_a0);
    for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
      ::std::__cxx11::string::operator+=(local_a0,local_60);
      uVar3 = in_stack_ffffffffffffff58 & 0xffffff;
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (CONCAT44(iVar4,in_stack_ffffffffffffff58) & 0xffffffff00ffffff),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,uVar2));
      bVar1 = FileUtils::fileExists(in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffff58 = uVar3;
      if (bVar1) {
        ::std::__cxx11::string::operator=((string *)directoryPrefix_abi_cxx11_,local_a0);
        in_stack_ffffffffffffff58 = CONCAT13(1,(int3)uVar3);
      }
      uVar3 = (uint)bVar1;
      if ((in_stack_ffffffffffffff58 & 0x1000000) == 0) {
        ::std::__cxx11::string::~string((string *)this);
      }
      if (uVar3 != 0) goto LAB_00201ebb;
      in_stack_ffffffffffffff54 = 0;
    }
    uVar3 = 0;
LAB_00201ebb:
    ::std::__cxx11::string::~string(local_a0);
    ::std::__cxx11::string::~string(local_60);
    if (uVar3 != 0) goto LAB_00201f0b;
  }
  ::std::__cxx11::string::string((string *)this,local_30);
LAB_00201f0b:
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string TestName::checkParentDirectoriesForFile(const std::string& file)
    {
        auto newFileName = directoryPrefix + file;

        if (!FileUtils::fileExists(newFileName))
        {
            // If the build system is Ninja, try looking several levels higher...
            std::string backOne = ".." + SystemUtils::getDirectorySeparator();
            std::string prefix;
            for (int i = 0; i != 10; i++)
            {
                prefix += backOne;
                auto candidateName = prefix + file;
                if (FileUtils::fileExists(candidateName))
                {
                    directoryPrefix = prefix;
                    return candidateName;
                }
            }
        }
        return newFileName;
    }